

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O3

CheckedError __thiscall
flatbuffers::Parser::ParseTable(Parser *this,StructDef *struct_def,string *value,uoffset_t *ovalue)

{
  FlatBufferBuilderImpl<false> *this_00;
  Parser *this_01;
  uoffset_t *puVar1;
  string **ppsVar2;
  pointer *ppuVar3;
  EnumDef **ppEVar4;
  voffset_t vVar5;
  FieldDef *__rhs;
  pointer pcVar6;
  pointer pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  _Base_ptr p_Var8;
  long lVar9;
  void *__src;
  string *psVar10;
  pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *ppVar11;
  int iVar12;
  Offset<flatbuffers::Vector<unsigned_char,_unsigned_int>_> t;
  int iVar13;
  uint uVar14;
  Offset<void> OVar15;
  uoffset_t uVar16;
  const_iterator cVar17;
  long *plVar18;
  size_t len;
  Value *pVVar19;
  long lVar20;
  long *plVar21;
  StructDef *struct_def_00;
  char cVar22;
  int t_00;
  pointer v;
  undefined8 uVar23;
  _Alloc_hider _Var24;
  string *psVar25;
  Parser *pPVar26;
  uoffset_t *in_R8;
  pointer pcVar27;
  pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *ppVar28;
  const_iterator __position;
  Value *pVVar29;
  Value *val_00;
  CheckedError *ce;
  bool bVar30;
  CheckedError ce_1;
  int local_1a8;
  StructDef *local_1a0;
  Builder builder;
  Value val;
  ulong local_a0;
  string name;
  string local_60;
  SymbolTable<flatbuffers::FieldDef> *local_40;
  string *local_38;
  
  iVar13 = *(int *)&struct_def[5].field_0x114;
  local_38 = (string *)ovalue;
  if (0x40 < iVar13) {
    __assert_fail("caller_depth_ <= (FLATBUFFERS_MAX_PARSING_DEPTH) && \"Check() must be called to prevent stack overflow\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                  ,0x19d,"flatbuffers::Parser::ParseDepthGuard::ParseDepthGuard(Parser *)");
  }
  *(int *)&struct_def[5].field_0x114 = iVar13 + 1;
  if (iVar13 == 0x40) {
    RecurseError(this);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (((ulong)(this->super_ParserState).prev_cursor_ & 1) != 0) goto LAB_0010f7e2;
  }
  else {
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
  }
  iVar13 = *(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc);
  t_00 = (int)struct_def;
  if (iVar13 == 0x5b) {
    Next((Parser *)&ce_1);
    local_1a8 = 0x5d;
  }
  else {
    Expect((Parser *)&ce_1,t_00);
    local_1a8 = 0x7d;
  }
  ce_1.has_been_checked_ = true;
  if (ce_1.is_error_ == false) {
    this_00 = (FlatBufferBuilderImpl<false> *)
              &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
               _M_node_count;
    local_40 = &struct_def[5].fields;
    local_1a0 = (StructDef *)0x0;
    do {
      if (((byte)(local_1a0 == (StructDef *)0x0 |
                 struct_def[3].super_Definition.name.field_2._M_local_buf[2] ^ 1U) == 1) &&
         (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == local_1a8))
      goto LAB_0010dfdd;
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      if (iVar13 == 0x5b) {
        if (local_1a0 <
            (StructDef *)
            ((long)value[8]._M_dataplus._M_p - *(long *)((long)&value[7].field_2 + 8) >> 3)) {
          std::__cxx11::string::_M_assign((string *)&name);
          goto LAB_0010da58;
        }
        builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&builder.buf_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
        val.type.base_type = 0x27;
        val.type.element = BASE_TYPE_NONE;
        builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)std::__cxx11::string::_M_create((ulong *)&builder,(ulong)&val);
        builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)val.type._0_8_;
        builtin_memcpy(builder.buf_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,"too many unnamed fields in nested array",
                       0x27);
        builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)val.type._0_8_;
        builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[val.type._0_8_] = '\0';
        Error((Parser *)&ce_1,(string *)struct_def);
        if ((pointer *)
            builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(builder.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (ulong)(builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        cVar22 = '\x01';
      }
      else {
        std::__cxx11::string::_M_assign((string *)&name);
        if (*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x101) {
          Next((Parser *)&ce_1);
        }
        else {
          Expect((Parser *)&ce_1,t_00);
        }
        ce_1.has_been_checked_ = true;
        cVar22 = '\x01';
        if (ce_1.is_error_ == false) {
          if (((char)struct_def[4].super_Definition.file._M_string_length != '\x01') ||
             ((*(uint *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) | 0x20) != 0x7b))
          {
            Expect((Parser *)&ce_1,t_00);
            ce_1.has_been_checked_ = true;
            cVar22 = '\x01';
            if (ce_1.is_error_ != false) goto LAB_0010df97;
          }
LAB_0010da58:
          iVar12 = std::__cxx11::string::compare((char *)&name);
          if (iVar12 == 0) {
            Expect((Parser *)&ce_1,t_00);
LAB_0010dbeb:
            if (ce_1.is_error_ == false) {
LAB_0010dbf6:
              ce_1.is_error_ = false;
            }
          }
          else {
            cVar17 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::FieldDef_*>_>_>
                             *)&value[6]._M_string_length,&name);
            if ((cVar17._M_node == (_Base_ptr)&value[6].field_2) ||
               (__rhs = *(FieldDef **)(cVar17._M_node + 2), __rhs == (FieldDef *)0x0)) {
              if (*(char *)((long)&struct_def[3].super_Definition.file._M_dataplus._M_p + 4) != '\0'
                 ) {
                SkipAnyJsonValue((Parser *)&ce_1);
                goto LAB_0010dbeb;
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &builder,"unknown field: ",&name);
              Error((Parser *)&ce_1,(string *)struct_def);
              uVar23 = builder.buf_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              _Var24._M_p = (pointer)builder.buf_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
              if ((pointer *)
                  builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start !=
                  &builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0010ddd4;
            }
            else {
              if (((*(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) == 0x104) &&
                  (iVar12 = std::__cxx11::string::compare
                                      ((char *)&(struct_def->super_Definition).file._M_string_length
                                      ), iVar12 == 0)) &&
                 (0xb < (__rhs->value).type.base_type - BASE_TYPE_UTYPE)) {
                Next((Parser *)&ce_1);
                goto LAB_0010dbeb;
              }
              val.type.base_type = (__rhs->value).type.base_type;
              val.type.element = (__rhs->value).type.element;
              val.type.struct_def = (__rhs->value).type.struct_def;
              val.type.enum_def = (__rhs->value).type.enum_def;
              val.type.fixed_length = (__rhs->value).type.fixed_length;
              val.type._26_6_ = *(undefined6 *)&(__rhs->value).type.field_0x1a;
              val.constant._M_dataplus._M_p = (pointer)&val.constant.field_2;
              pcVar6 = (__rhs->value).constant._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&val.constant,pcVar6,
                         pcVar6 + (__rhs->value).constant._M_string_length);
              val.offset = (__rhs->value).offset;
              if (__rhs->flexbuffer == true) {
                flexbuffers::Builder::Builder(&builder,0x400,BUILDER_FLAG_SHARE_ALL);
                ParseFlexBufferValue((Parser *)&ce_1,(Builder *)struct_def);
                ce_1.has_been_checked_ = true;
                if (ce_1.is_error_ == false) {
                  flexbuffers::Builder::Finish(&builder);
                  if (builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_finish !=
                      builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start) {
                    if (struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_right < (_Base_ptr)0x8) {
                      struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_right = (_Base_ptr)0x8;
                    }
                    vector_downward<unsigned_int>::fill
                              ((vector_downward<unsigned_int> *)this_00,
                               (ulong)((int)builder.buf_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start -
                                       ((int)builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish +
                                       struct_def[1].super_Definition.serialized_location) & 7));
                  }
                  if (builder.finished_ == false) {
                    __assert_fail("finished_",
                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                                  ,0x592,"void flexbuffers::Builder::Finished() const");
                  }
                  v = builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start;
                  if ((long)builder.buf_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)builder.buf_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start == 0) {
                    v = &data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
                         ::t;
                  }
                  t = FlatBufferBuilderImpl<false>::
                      CreateVector<unsigned_char,_flatbuffers::Offset,_flatbuffers::Vector>
                                (this_00,v,
                                 (long)builder.buf_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)builder.buf_.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
                  NumToString<unsigned_int>(&local_60,t.o);
                  std::__cxx11::string::operator=((string *)&val.constant,(string *)&local_60);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_60._M_dataplus._M_p != &local_60.field_2) {
                    operator_delete(local_60._M_dataplus._M_p,
                                    (ulong)(local_60.field_2._M_allocated_capacity + 1));
                  }
                  std::
                  _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>,_std::_Identity<std::pair<unsigned_long,_unsigned_long>_>,_flexbuffers::Builder::StringOffsetCompare,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ::~_Rb_tree(&builder.string_pool._M_t);
                  std::
                  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>
                  ::~_Rb_tree(&builder.key_pool._M_t);
                  if (builder.stack_.
                      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(builder.stack_.
                                    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)builder.stack_.
                                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)builder.stack_.
                                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                  if (builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(builder.buf_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)builder.buf_.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)builder.buf_.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
LAB_0010dde1:
                  lVar9 = *(long *)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header.
                                    _M_header;
                  ppVar28 = (pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)(lVar9 + 0x50);
                  lVar20 = (long)local_1a0 * -0x50;
                  do {
                    __position._M_current =
                         (pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)
                         ((long)local_1a0 * -0x50 + lVar9);
                    if (lVar20 == 0) break;
                    ppVar11 = ppVar28 + -2;
                    if (ppVar11->second == __rhs) {
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&builder,"field set more than once: ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)__rhs);
                      Error((Parser *)&ce_1,(string *)struct_def);
                      if ((pointer *)
                          builder.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start !=
                          &builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(builder.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (ulong)(builder.buf_.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                               1));
                      }
                      bVar30 = false;
                      goto LAB_0010df18;
                    }
                    ppVar28 = ppVar28 + -1;
                    lVar20 = lVar20 + 0x50;
                    __position._M_current = ppVar28;
                  } while ((__rhs->value).offset <= (ppVar11->second->value).offset);
                  builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)val.type.enum_def;
                  builder.stack_.
                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)val.type._24_8_;
                  builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)val.type._0_8_;
                  builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)val.type.struct_def;
                  builder.stack_.
                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&builder.finished_;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)
                             &builder.stack_.
                              super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                             val.constant._M_dataplus._M_p,
                             val.constant._M_dataplus._M_p + val.constant._M_string_length);
                  builder.key_pool._M_t._M_impl.
                  super__Rb_tree_key_compare<flexbuffers::Builder::KeyOffsetCompare>._M_key_compare.
                  buf_._0_2_ = val.offset;
                  builder.key_pool._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = __rhs;
                  std::
                  vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                  ::_M_insert_rval((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                                    *)local_40,__position,(value_type *)&builder);
                  if (builder.stack_.
                      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                      ._M_impl.super__Vector_impl_data._M_finish != (pointer)&builder.finished_) {
                    operator_delete(builder.stack_.
                                    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish,
                                    CONCAT71(builder._49_7_,builder.finished_) + 1);
                  }
                  local_1a0 = (StructDef *)
                              ((long)&(local_1a0->super_Definition).name._M_dataplus._M_p + 1);
                  bVar30 = true;
LAB_0010df18:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)val.constant._M_dataplus._M_p != &val.constant.field_2) {
                    operator_delete(val.constant._M_dataplus._M_p,
                                    val.constant.field_2._M_allocated_capacity + 1);
                  }
                  if (!bVar30) goto LAB_0010df46;
                  goto LAB_0010dbf6;
                }
                std::
                _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<unsigned_long,_unsigned_long>,_std::_Identity<std::pair<unsigned_long,_unsigned_long>_>,_flexbuffers::Builder::StringOffsetCompare,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                ::~_Rb_tree(&builder.string_pool._M_t);
                std::
                _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_flexbuffers::Builder::KeyOffsetCompare,_std::allocator<unsigned_long>_>
                ::~_Rb_tree(&builder.key_pool._M_t);
                if (builder.stack_.
                    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(builder.stack_.
                                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)builder.stack_.
                                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)builder.stack_.
                                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)builder.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)builder.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              else {
                if (__rhs->nested_flatbuffer == (StructDef *)0x0) {
                  ParseAnyValue((Parser *)&ce_1,(Value *)struct_def,(FieldDef *)&val,(size_t)__rhs,
                                local_1a0,(size_t)value,false);
                }
                else {
                  ParseNestedFlatbuffer
                            ((Parser *)&ce_1,(Value *)struct_def,(FieldDef *)&val,(size_t)__rhs,
                             local_1a0);
                }
                ce_1.has_been_checked_ = true;
                if (ce_1.is_error_ == false) goto LAB_0010dde1;
              }
              uVar23 = val.constant.field_2._M_allocated_capacity;
              _Var24._M_p = val.constant._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)val.constant._M_dataplus._M_p != &val.constant.field_2) {
LAB_0010ddd4:
                operator_delete(_Var24._M_p,(ulong)(uVar23 + 1));
              }
            }
          }
LAB_0010df46:
          ce_1.has_been_checked_ = true;
          cVar22 = '\x01';
          if ((ce_1.is_error_ == false) &&
             (cVar22 = '\x02',
             *(int *)((long)&(struct_def->super_Definition).name.field_2 + 0xc) != local_1a8)) {
            if (((char)struct_def[4].super_Definition.file._M_string_length != '\0') ||
               (Expect((Parser *)&ce_1,t_00), ce_1.is_error_ == false)) {
              ce_1.is_error_ = false;
            }
            ce_1.has_been_checked_ = true;
            cVar22 = ce_1.is_error_;
          }
        }
      }
LAB_0010df97:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,
                        CONCAT71(name.field_2._M_allocated_capacity._1_7_,
                                 name.field_2._M_local_buf[0]) + 1);
      }
    } while (cVar22 == '\0');
    if (cVar22 == '\x02') {
LAB_0010dfdd:
      Next((Parser *)&ce_1);
      ce_1.has_been_checked_ = true;
      if (ce_1.is_error_ == false) {
        if ((iVar13 == 0x5b) &&
           (local_1a0 !=
            (StructDef *)
            ((long)value[8]._M_dataplus._M_p - *(long *)((long)&value[7].field_2 + 8) >> 3))) {
          builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)&builder.buf_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
          val.type.base_type = 0x2e;
          val.type.element = BASE_TYPE_NONE;
          builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)std::__cxx11::string::_M_create((ulong *)&builder,(ulong)&val);
          builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)val.type._0_8_;
          builtin_memcpy(builder.buf_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         "wrong number of unnamed fields in table vector",0x2e);
          builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)val.type._0_8_;
          builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[val.type._0_8_] = '\0';
          Error((Parser *)&ce_1,(string *)struct_def);
          if ((pointer *)
              builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_start !=
              &builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(builder.buf_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (ulong)(builder.buf_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
          }
        }
        else {
          ce_1.is_error_ = false;
        }
      }
    }
  }
  else {
    local_1a0 = (StructDef *)0x0;
  }
  *(bool *)&(this->super_ParserState).prev_cursor_ = ce_1.is_error_;
  ce_1.has_been_checked_ = true;
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (ce_1.is_error_ == false) {
    pcVar6 = *(pointer *)((long)&value[7].field_2 + 8);
    pcVar7 = value[8]._M_dataplus._M_p;
    if (pcVar6 != pcVar7) {
      pcVar27 = pcVar6;
      do {
        __rhs_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pcVar27;
        lVar9 = (long)local_1a0 * -0x50;
        if (*(int *)((long)&__rhs_00[8].field_2 + 8) == 0) {
          while( true ) {
            if (lVar9 == 0) {
              std::operator+(&local_60,"required field is missing: ",__rhs_00);
              plVar18 = (long *)std::__cxx11::string::append((char *)&local_60);
              ppEVar4 = &val.type.enum_def;
              plVar21 = plVar18 + 2;
              if ((long *)*plVar18 == plVar21) {
                val.type.enum_def = (EnumDef *)*plVar21;
                val.type._24_8_ = plVar18[3];
                val.type._0_8_ = ppEVar4;
              }
              else {
                val.type.enum_def = (EnumDef *)*plVar21;
                val.type._0_8_ = (long *)*plVar18;
              }
              val.type.struct_def = (StructDef *)plVar18[1];
              *plVar18 = (long)plVar21;
              plVar18[1] = 0;
              *(undefined1 *)(plVar18 + 2) = 0;
              plVar18 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&val,(ulong)(value->_M_dataplus)._M_p);
              ppuVar3 = &builder.buf_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
              plVar21 = plVar18 + 2;
              if ((long *)*plVar18 == plVar21) {
                builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar21;
                builder.stack_.
                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar18[3];
                builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar3;
              }
              else {
                builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*plVar21;
                builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)*plVar18;
              }
              builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)plVar18[1];
              *plVar18 = (long)plVar21;
              plVar18[1] = 0;
              *(undefined1 *)(plVar18 + 2) = 0;
              Error(this,(string *)struct_def);
              if ((pointer *)
                  builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != ppuVar3) {
                operator_delete(builder.buf_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (ulong)(builder.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
              }
              if ((EnumDef **)val.type._0_8_ != ppEVar4) {
                operator_delete((void *)val.type._0_8_,
                                (ulong)((long)&((val.type.enum_def)->super_Definition).name.
                                               _M_dataplus._M_p + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) goto LAB_0010f7cf;
              goto LAB_0010f7d7;
            }
            if (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                 (*(long *)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header +
                  0x48 + lVar9) == __rhs_00) break;
            lVar9 = lVar9 + 0x50;
          }
        }
        pcVar27 = pcVar27 + 8;
      } while (pcVar27 != pcVar7);
    }
    if (value[8].field_2._M_local_buf[0] == '\x01') {
      if (local_1a0 != (StructDef *)((long)pcVar7 - (long)pcVar6 >> 3)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&builder
                       ,"struct: wrong number of initializers: ",value);
        Error(this,(string *)struct_def);
        local_60.field_2._M_allocated_capacity =
             (size_type)
             builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_60._M_dataplus._M_p =
             (pointer)builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        if ((pointer *)
            builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
LAB_0010f7cf:
          operator_delete(local_60._M_dataplus._M_p,
                          (ulong)((long)&(((Namespace *)local_60.field_2._M_allocated_capacity)->
                                         components).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        goto LAB_0010f7d7;
      }
      p_Var8 = *(_Base_ptr *)((long)&value[8].field_2 + 8);
      if (struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right < p_Var8)
      {
        struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var8;
      }
      vector_downward<unsigned_int>::fill
                ((vector_downward<unsigned_int> *)
                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count,
                 (ulong)((long)&p_Var8[-1]._M_right + 7) &
                 -(ulong)struct_def[1].super_Definition.serialized_location);
    }
    else {
      FlatBufferBuilderImpl<false>::NotNested
                ((FlatBufferBuilderImpl<false> *)
                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
      *(undefined1 *)&struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left
           = 1;
    }
    uVar16 = struct_def[1].super_Definition.serialized_location;
    local_a0 = 1;
    if (value[8].field_2._M_local_buf[2] != '\0') {
      local_a0 = 8;
    }
    this_01 = (Parser *)
              &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.super__Rb_tree_header.
               _M_node_count;
    pVVar19 = *(Value **)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      pVVar29 = pVVar19;
      if ((long)local_1a0 * -0x50 != 0) {
        do {
          val_00 = (Value *)((long)(pVVar29 + 0xfffffffffffffffe) + 0x40);
          lVar9 = *(long *)((long)(pVVar29 + 0xffffffffffffffff) + 0x40);
          uVar14 = *(uint *)((long)(pVVar29 + 0xfffffffffffffffe) + 0x40);
          if (value[8].field_2._M_local_buf[2] == '\x01') {
            if (0x12 < uVar14) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                            ,0x9f,"size_t flatbuffers::SizeOf(const BaseType)");
            }
            if (local_a0 == *(ulong *)(&DAT_0014f308 + (ulong)uVar14 * 8)) goto code_r0x0010e227;
          }
          else {
code_r0x0010e227:
            pPVar26 = this_01;
            switch((ulong)uVar14) {
            case 0:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar9 + 200) - 1U < 0xc) && (*(int *)(lVar9 + 0x118) == 1)) {
                iVar13 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U));
                if (iVar13 != 0) {
                  anon_unknown_0::atot<unsigned_char>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(uchar *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                  vVar5 = *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38);
                  uVar14 = FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (uchar)builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar5,uVar14);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,*(char **)(lVar9 + 0xe8),(Parser *)struct_def,
                           (uchar *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (undefined1)val.type.base_type);
              }
              break;
            case 1:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar9 + 200) - 1U < 0xc) && (*(int *)(lVar9 + 0x118) == 1)) {
                iVar13 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U));
                if (iVar13 != 0) {
                  anon_unknown_0::atot<unsigned_char>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(uchar *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                  vVar5 = *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38);
                  uVar14 = FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (uchar)builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar5,uVar14);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,*(char **)(lVar9 + 0xe8),(Parser *)struct_def,
                           (uchar *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (undefined1)val.type.base_type);
              }
              break;
            case 2:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar9 + 200) - 1U < 0xc) && (*(int *)(lVar9 + 0x118) == 1)) {
                iVar13 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U));
                if (iVar13 != 0) {
                  anon_unknown_0::atot<unsigned_char>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(uchar *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                  vVar5 = *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38);
                  uVar14 = FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (uchar)builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar5,uVar14);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,*(char **)(lVar9 + 0xe8),(Parser *)struct_def,
                           (uchar *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (undefined1)val.type.base_type);
              }
              break;
            case 3:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<signed_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(char *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar9 + 200) - 1U < 0xc) && (*(int *)(lVar9 + 0x118) == 1)) {
                iVar13 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U));
                if (iVar13 != 0) {
                  anon_unknown_0::atot<signed_char>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(char *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                  vVar5 = *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38);
                  uVar14 = FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (uchar)builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar5,uVar14);
                }
              }
              else {
                anon_unknown_0::atot<signed_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(char *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                anon_unknown_0::atot<signed_char>
                          ((anon_unknown_0 *)this,*(char **)(lVar9 + 0xe8),(Parser *)struct_def,
                           (char *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::AddElement<signed_char>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (undefined1)val.type.base_type);
              }
              break;
            case 4:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar9 + 200) - 1U < 0xc) && (*(int *)(lVar9 + 0x118) == 1)) {
                iVar13 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U));
                if (iVar13 != 0) {
                  anon_unknown_0::atot<unsigned_char>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(uchar *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                  vVar5 = *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38);
                  uVar14 = FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (uchar)builder.buf_.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar5,uVar14);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uchar *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                anon_unknown_0::atot<unsigned_char>
                          ((anon_unknown_0 *)this,*(char **)(lVar9 + 0xe8),(Parser *)struct_def,
                           (uchar *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (uchar)builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                           (undefined1)val.type.base_type);
              }
              break;
            case 5:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<short>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(short *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (unsigned_short)
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar9 + 200) - 1U < 0xc) && (*(int *)(lVar9 + 0x118) == 1)) {
                iVar13 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U));
                if (iVar13 != 0) {
                  anon_unknown_0::atot<short>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(short *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                  vVar5 = *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38);
                  uVar14 = FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (unsigned_short)
                                      builder.buf_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar5,uVar14);
                }
              }
              else {
                anon_unknown_0::atot<short>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(short *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                anon_unknown_0::atot<short>
                          ((anon_unknown_0 *)this,*(char **)(lVar9 + 0xe8),(Parser *)struct_def,
                           (short *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::AddElement<short>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (unsigned_short)
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,(undefined2)val.type.base_type);
              }
              break;
            case 6:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_short>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(unsigned_short *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_short,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (unsigned_short)
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar9 + 200) - 1U < 0xc) && (*(int *)(lVar9 + 0x118) == 1)) {
                iVar13 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U));
                if (iVar13 != 0) {
                  anon_unknown_0::atot<unsigned_short>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(unsigned_short *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                  vVar5 = *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38);
                  uVar14 = FlatBufferBuilderImpl<false>::PushElement<unsigned_short,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (unsigned_short)
                                      builder.buf_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar5,uVar14);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_short>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(unsigned_short *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                anon_unknown_0::atot<unsigned_short>
                          ((anon_unknown_0 *)this,*(char **)(lVar9 + 0xe8),(Parser *)struct_def,
                           (unsigned_short *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_short>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (unsigned_short)
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,(undefined2)val.type.base_type);
              }
              break;
            case 7:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<int>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(int *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (int)builder.buf_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_);
              }
              else if ((*(int *)(lVar9 + 200) - 1U < 0xc) && (*(int *)(lVar9 + 0x118) == 1)) {
                iVar13 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U));
                if (iVar13 != 0) {
                  anon_unknown_0::atot<int>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(int *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                  vVar5 = *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38);
                  uVar14 = FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (int)builder.buf_.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_4_);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar5,uVar14);
                }
              }
              else {
                anon_unknown_0::atot<int>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(int *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                anon_unknown_0::atot<int>
                          ((anon_unknown_0 *)this,*(char **)(lVar9 + 0xe8),(Parser *)struct_def,
                           (int *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::AddElement<int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (int)builder.buf_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_,val.type.base_type);
              }
              break;
            case 8:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_int>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uint *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (uint)builder.buf_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_);
              }
              else if ((*(int *)(lVar9 + 200) - 1U < 0xc) && (*(int *)(lVar9 + 0x118) == 1)) {
                iVar13 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U));
                if (iVar13 != 0) {
                  anon_unknown_0::atot<unsigned_int>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(uint *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                  vVar5 = *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38);
                  uVar14 = FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (uint)builder.buf_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar5,uVar14);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_int>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(uint *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                anon_unknown_0::atot<unsigned_int>
                          ((anon_unknown_0 *)this,*(char **)(lVar9 + 0xe8),(Parser *)struct_def,
                           (uint *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (uint)builder.buf_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_4_,val.type.base_type);
              }
              break;
            case 9:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<long>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(long *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (long)builder.buf_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar9 + 200) - 1U < 0xc) && (*(int *)(lVar9 + 0x118) == 1)) {
                iVar13 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U));
                if (iVar13 != 0) {
                  anon_unknown_0::atot<long>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(long *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                  vVar5 = *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38);
                  uVar14 = FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (long)builder.buf_.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar5,uVar14);
                }
              }
              else {
                anon_unknown_0::atot<long>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(long *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                anon_unknown_0::atot<long>
                          ((anon_unknown_0 *)this,*(char **)(lVar9 + 0xe8),(Parser *)struct_def,
                           (long *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::AddElement<long>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (long)builder.buf_.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,val.type._0_8_);
              }
              break;
            case 10:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<unsigned_long>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(unsigned_long *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (unsigned_long)
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar9 + 200) - 1U < 0xc) && (*(int *)(lVar9 + 0x118) == 1)) {
                iVar13 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U));
                if (iVar13 != 0) {
                  anon_unknown_0::atot<unsigned_long>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(unsigned_long *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                  vVar5 = *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38);
                  uVar14 = FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (unsigned_long)
                                      builder.buf_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar5,uVar14);
                }
              }
              else {
                anon_unknown_0::atot<unsigned_long>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(unsigned_long *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                anon_unknown_0::atot<unsigned_long>
                          ((anon_unknown_0 *)this,*(char **)(lVar9 + 0xe8),(Parser *)struct_def,
                           (unsigned_long *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::AddElement<unsigned_long>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (unsigned_long)
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,val.type._0_8_);
              }
              break;
            case 0xb:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<float>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(float *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::PushElement<float,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_);
              }
              else if ((*(int *)(lVar9 + 200) - 1U < 0xc) && (*(int *)(lVar9 + 0x118) == 1)) {
                iVar13 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U));
                if (iVar13 != 0) {
                  anon_unknown_0::atot<float>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(float *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                  vVar5 = *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38);
                  uVar14 = FlatBufferBuilderImpl<false>::PushElement<float,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      builder.buf_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar5,uVar14);
                }
              }
              else {
                anon_unknown_0::atot<float>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(float *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                anon_unknown_0::atot<float>
                          ((anon_unknown_0 *)this,*(char **)(lVar9 + 0xe8),(Parser *)struct_def,
                           (float *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::AddElement<float>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           builder.buf_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._0_4_,(float)val.type.base_type);
              }
              break;
            case 0xc:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if (value[8].field_2._M_local_buf[0] == '\x01') {
                anon_unknown_0::atot<double>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(double *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::PushElement<double,unsigned_int>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           (double)builder.buf_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
              }
              else if ((*(int *)(lVar9 + 200) - 1U < 0xc) && (*(int *)(lVar9 + 0x118) == 1)) {
                iVar13 = std::__cxx11::string::compare
                                   ((char *)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U));
                if (iVar13 != 0) {
                  anon_unknown_0::atot<double>
                            ((anon_unknown_0 *)this,
                             *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18U),
                             (Parser *)struct_def,(double *)&builder);
                  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                  vVar5 = *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38);
                  uVar14 = FlatBufferBuilderImpl<false>::PushElement<double,unsigned_int>
                                     ((FlatBufferBuilderImpl<false> *)this_01,
                                      (double)builder.buf_.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                  FlatBufferBuilderImpl<false>::TrackField
                            ((FlatBufferBuilderImpl<false> *)this_01,vVar5,uVar14);
                }
              }
              else {
                anon_unknown_0::atot<double>
                          ((anon_unknown_0 *)this,
                           *(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18),
                           (Parser *)struct_def,(double *)&builder);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                anon_unknown_0::atot<double>
                          ((anon_unknown_0 *)this,*(char **)(lVar9 + 0xe8),(Parser *)struct_def,
                           (double *)&val);
                *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
                if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_0010f7d7;
                FlatBufferBuilderImpl<false>::AddElement<double>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (double)builder.buf_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start,(double)val.type._0_8_)
                ;
              }
              break;
            case 0xd:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if ((*(int *)(lVar9 + 200) == 0xf) &&
                 (struct_def_00 = *(StructDef **)(lVar9 + 0xd0), struct_def_00->fixed != false)) {
LAB_0010e803:
                SerializeStruct(pPVar26,(FlatBufferBuilder *)this_01,struct_def_00,val_00);
              }
              else if (*(char *)(lVar9 + 0x115) == '\0') {
                OVar15.o = atoi(*(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),OVar15);
              }
              else {
                iVar13 = atoi(*(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (Offset64<void>)(long)iVar13);
              }
              break;
            case 0xe:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if ((*(int *)(lVar9 + 200) == 0xf) &&
                 (struct_def_00 = *(StructDef **)(lVar9 + 0xd0), struct_def_00->fixed != false))
              goto LAB_0010e803;
              if (*(char *)(lVar9 + 0x115) == '\0') {
                OVar15.o = atoi(*(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),OVar15);
              }
              else {
                iVar13 = atoi(*(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (Offset64<void>)(long)iVar13);
              }
              break;
            case 0xf:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if ((*(int *)(lVar9 + 200) == 0xf) &&
                 (struct_def_00 = *(StructDef **)(lVar9 + 0xd0), struct_def_00->fixed != false))
              goto LAB_0010e803;
              if (*(char *)(lVar9 + 0x115) == '\0') {
                OVar15.o = atoi(*(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),OVar15);
              }
              else {
                iVar13 = atoi(*(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (Offset64<void>)(long)iVar13);
              }
              break;
            case 0x10:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if ((*(int *)(lVar9 + 200) == 0xf) &&
                 (struct_def_00 = *(StructDef **)(lVar9 + 0xd0), struct_def_00->fixed == true))
              goto LAB_0010e803;
              if (*(char *)(lVar9 + 0x115) == '\0') {
                OVar15.o = atoi(*(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),OVar15);
              }
              else {
                iVar13 = atoi(*(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (Offset64<void>)(long)iVar13);
              }
              break;
            case 0x11:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              __src = *(void **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18);
              len = InlineSize((Type *)val_00);
              if (len != 0) {
                vector_downward<unsigned_int>::ensure_space
                          ((vector_downward<unsigned_int> *)this_01,len);
                psVar25 = (string *)((long)struct_def[1].super_Definition.declaration_file - len);
                struct_def[1].super_Definition.declaration_file = psVar25;
                puVar1 = &struct_def[1].super_Definition.serialized_location;
                *puVar1 = *puVar1 + (int)len;
                memcpy(psVar25,__src,len);
              }
              break;
            case 0x12:
              vector_downward<unsigned_int>::fill
                        ((vector_downward<unsigned_int> *)this_01,*(size_t *)(lVar9 + 0x128));
              if ((*(int *)(lVar9 + 200) == 0xf) &&
                 (struct_def_00 = *(StructDef **)(lVar9 + 0xd0), struct_def_00->fixed != false))
              goto LAB_0010e803;
              if (*(char *)(lVar9 + 0x115) == '\0') {
                iVar13 = atoi(*(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (Offset64<void>)(long)iVar13);
              }
              else {
                iVar13 = atoi(*(char **)((long)(pVVar29 + 0xffffffffffffffff) + 0x18));
                *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0x100;
                FlatBufferBuilderImpl<false>::AddOffset<void>
                          ((FlatBufferBuilderImpl<false> *)this_01,
                           *(voffset_t *)((long)(pVVar29 + 0xffffffffffffffff) + 0x38),
                           (Offset64<void>)(long)iVar13);
              }
            }
          }
          pVVar19 = *(Value **)
                     &struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header;
          pVVar29 = val_00;
        } while (val_00 != (Value *)((long)local_1a0 * -0x50 + (long)pVVar19));
      }
      psVar25 = local_38;
      bVar30 = 1 < local_a0;
      local_a0 = local_a0 >> 1;
    } while (bVar30);
    for (; local_1a0 != (StructDef *)0x0;
        local_1a0 = (StructDef *)
                    ((long)&local_1a0[-1].reserved_ids.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 7)) {
      lVar9 = *(long *)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header;
      *(long *)&struct_def[5].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header =
           lVar9 + -0x50;
      if (*(long **)(lVar9 + -0x30) != (long *)(lVar9 + -0x20)) {
        operator_delete(*(long **)(lVar9 + -0x30),*(long *)(lVar9 + -0x20) + 1);
      }
    }
    if (value[8].field_2._M_local_buf[0] == '\0') {
      uVar16 = FlatBufferBuilderImpl<false>::EndTable
                         ((FlatBufferBuilderImpl<false> *)this_01,uVar16);
      if (in_R8 != (uoffset_t *)0x0) {
        *in_R8 = uVar16;
      }
      if (psVar25 != (string *)0x0) {
        NumToString<unsigned_int>((string *)&builder,uVar16);
        std::__cxx11::string::operator=((string *)psVar25,(string *)&builder);
        if ((pointer *)
            builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &builder.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(builder.buf_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (ulong)(builder.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
      }
    }
    else {
      *(ulong *)&struct_def[1].fields.dict._M_t._M_impl =
           *(long *)&struct_def[1].fields.dict._M_t._M_impl +
           (ulong)struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color *
           -8;
      struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      *(undefined2 *)
       &struct_def[1].fields.dict._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4 = 0;
      if (psVar25 == (string *)0x0) {
        __assert_fail("value",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                      ,0x676,
                      "CheckedError flatbuffers::Parser::ParseTable(const StructDef &, std::string *, uoffset_t *)"
                     );
      }
      psVar10 = struct_def[1].super_Definition.declaration_file;
      if (psVar10 == (string *)0x0) {
        __assert_fail("cur_",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector_downward.h"
                      ,0xb3,
                      "uint8_t *flatbuffers::vector_downward<>::data() const [SizeT = unsigned int]"
                     );
      }
      std::__cxx11::string::_M_replace
                ((ulong)psVar25,0,(char *)psVar25->_M_string_length,(ulong)psVar10);
      pcVar6 = value[9]._M_dataplus._M_p;
      ppsVar2 = &struct_def[1].super_Definition.declaration_file;
      *ppsVar2 = (string *)(pcVar6 + (long)&((*ppsVar2)->_M_dataplus)._M_p);
      puVar1 = &struct_def[1].super_Definition.serialized_location;
      *puVar1 = *puVar1 - (int)pcVar6;
      if (in_R8 != (uoffset_t *)0x0) {
        __assert_fail("!ovalue",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                      ,0x67d,
                      "CheckedError flatbuffers::Parser::ParseTable(const StructDef &, std::string *, uoffset_t *)"
                     );
      }
    }
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
LAB_0010f7d7:
  if (ce_1.has_been_checked_ == false) {
    __assert_fail("has_been_checked_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0x3a4,"flatbuffers::CheckedError::~CheckedError()");
  }
LAB_0010f7e2:
  *(int *)&struct_def[5].field_0x114 = *(int *)&struct_def[5].field_0x114 + -1;
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseTable(const StructDef &struct_def, std::string *value,
                                uoffset_t *ovalue) {
  ParseDepthGuard depth_guard(this);
  ECHECK(depth_guard.Check());

  size_t fieldn_outer = 0;
  auto err = ParseTableDelimiters(
      fieldn_outer, &struct_def,
      [&](const std::string &name, size_t &fieldn,
          const StructDef *struct_def_inner) -> CheckedError {
        if (name == "$schema") {
          ECHECK(Expect(kTokenStringConstant));
          return NoError();
        }
        auto field = struct_def_inner->fields.Lookup(name);
        if (!field) {
          if (!opts.skip_unexpected_fields_in_json) {
            return Error("unknown field: " + name);
          } else {
            ECHECK(SkipAnyJsonValue());
          }
        } else {
          if (IsIdent("null") && !IsScalar(field->value.type.base_type)) {
            ECHECK(Next());  // Ignore this field.
          } else {
            Value val = field->value;
            if (field->flexbuffer) {
              flexbuffers::Builder builder(1024,
                                           flexbuffers::BUILDER_FLAG_SHARE_ALL);
              ECHECK(ParseFlexBufferValue(&builder));
              builder.Finish();
              // Force alignment for nested flexbuffer
              builder_.ForceVectorAlignment(builder.GetSize(), sizeof(uint8_t),
                                            sizeof(largest_scalar_t));
              auto off = builder_.CreateVector(builder.GetBuffer());
              val.constant = NumToString(off.o);
            } else if (field->nested_flatbuffer) {
              ECHECK(
                  ParseNestedFlatbuffer(val, field, fieldn, struct_def_inner));
            } else {
              ECHECK(ParseAnyValue(val, field, fieldn, struct_def_inner, 0));
            }
            // Hardcoded insertion-sort with error-check.
            // If fields are specified in order, then this loop exits
            // immediately.
            auto elem = field_stack_.rbegin();
            for (; elem != field_stack_.rbegin() + fieldn; ++elem) {
              auto existing_field = elem->second;
              if (existing_field == field)
                return Error("field set more than once: " + field->name);
              if (existing_field->value.offset < field->value.offset) break;
            }
            // Note: elem points to before the insertion point, thus .base()
            // points to the correct spot.
            field_stack_.insert(elem.base(), std::make_pair(val, field));
            fieldn++;
          }
        }
        return NoError();
      });
  ECHECK(err);

  // Check if all required fields are parsed.
  for (auto field_it = struct_def.fields.vec.begin();
       field_it != struct_def.fields.vec.end(); ++field_it) {
    auto required_field = *field_it;
    if (!required_field->IsRequired()) { continue; }
    bool found = false;
    for (auto pf_it = field_stack_.end() - fieldn_outer;
         pf_it != field_stack_.end(); ++pf_it) {
      auto parsed_field = pf_it->second;
      if (parsed_field == required_field) {
        found = true;
        break;
      }
    }
    if (!found) {
      return Error("required field is missing: " + required_field->name +
                   " in " + struct_def.name);
    }
  }

  if (struct_def.fixed && fieldn_outer != struct_def.fields.vec.size())
    return Error("struct: wrong number of initializers: " + struct_def.name);

  auto start = struct_def.fixed ? builder_.StartStruct(struct_def.minalign)
                                : builder_.StartTable();

  for (size_t size = struct_def.sortbysize ? sizeof(largest_scalar_t) : 1; size;
       size /= 2) {
    // Go through elements in reverse, since we're building the data backwards.
    // TODO(derekbailey): this doesn't work when there are Offset64 fields, as
    // those have to be built first. So this needs to be changed to iterate over
    // Offset64 then Offset32 fields.
    for (auto it = field_stack_.rbegin();
         it != field_stack_.rbegin() + fieldn_outer; ++it) {
      auto &field_value = it->first;
      auto field = it->second;
      if (!struct_def.sortbysize ||
          size == SizeOf(field_value.type.base_type)) {
        switch (field_value.type.base_type) {
          // clang-format off
          #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
            case BASE_TYPE_ ## ENUM: \
              builder_.Pad(field->padding); \
              if (struct_def.fixed) { \
                CTYPE val; \
                ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                builder_.PushElement(val); \
              } else { \
                if (field->IsScalarOptional()) { \
                  if (field_value.constant != "null") { \
                    CTYPE val; \
                    ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                    builder_.AddElement(field_value.offset, val); \
                  } \
                } else { \
                  CTYPE val, valdef; \
                  ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                  ECHECK(atot(field->value.constant.c_str(), *this, &valdef)); \
                  builder_.AddElement(field_value.offset, val, valdef); \
                } \
              } \
              break;
            FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
          #undef FLATBUFFERS_TD
          #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
            case BASE_TYPE_ ## ENUM: \
              builder_.Pad(field->padding); \
              if (IsStruct(field->value.type)) { \
                SerializeStruct(*field->value.type.struct_def, field_value); \
              } else { \
                /* Special case for fields that use 64-bit addressing */ \
                if(field->offset64) { \
                  Offset64<void> offset; \
                  ECHECK(atot(field_value.constant.c_str(), *this, &offset)); \
                  builder_.AddOffset(field_value.offset, offset); \
                } else { \
                  CTYPE val; \
                  ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                  builder_.AddOffset(field_value.offset, val); \
                } \
              } \
              break;
            FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
          #undef FLATBUFFERS_TD
            case BASE_TYPE_ARRAY:
              builder_.Pad(field->padding);
              builder_.PushBytes(
                reinterpret_cast<const uint8_t*>(field_value.constant.c_str()),
                InlineSize(field_value.type));
              break;
            // clang-format on
        }
      }
    }
  }